

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O0

void __thiscall
duckdb::Relation::Relation
          (Relation *this,shared_ptr<duckdb::ClientContextWrapper,_true> *context,RelationType type,
          string *alias_p)

{
  undefined1 in_DL;
  shared_ptr<duckdb::ClientContextWrapper,_true> *in_RDI;
  RelationType in_stack_0000004f;
  shared_ptr<duckdb::ClientContextWrapper,_true> *in_stack_ffffffffffffffb8;
  
  enable_shared_from_this<duckdb::Relation>::enable_shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)0x196342c);
  (in_RDI->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__Relation_0350cc60;
  shared_ptr<duckdb::ClientContextWrapper,_true>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  *(undefined1 *)
   &in_RDI[2].internal.super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_DL;
  CreateRelationAlias(in_stack_0000004f,(string *)this);
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *)0x1963483);
  return;
}

Assistant:

Relation(const shared_ptr<ClientContextWrapper> &context, RelationType type, const string &alias_p = "")
	    : context(context), type(type), alias(CreateRelationAlias(type, alias_p)) {
	}